

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_bytedata9_Test::TestBody
          (ConfidentialValue_Constractor_bytedata9_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  int64_t local_170;
  undefined1 local_168;
  Amount local_160;
  int64_t local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  bool local_122;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  int local_fc;
  ByteData local_f8;
  size_t local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator local_71;
  string local_70;
  ByteData local_50;
  undefined1 local_38 [8];
  ConfidentialValue value;
  ConfidentialValue_Constractor_bytedata9_Test *this_local;
  
  value._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"010000000005f5e100",&local_71);
  cfd::core::ByteData::ByteData(&local_50,&local_70);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_38,&local_50);
  cfd::core::ByteData::~ByteData(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_b8,(ConfidentialValue *)local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_98,"value.GetHex().c_str()","\"010000000005f5e100\"",pcVar2,
             "010000000005f5e100");
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  cfd::core::ConfidentialValue::GetData(&local_f8,(ConfidentialValue *)local_38);
  local_e0 = cfd::core::ByteData::GetDataSize(&local_f8);
  local_fc = 9;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_d8,"value.GetData().GetDataSize()","9",&local_e0,&local_fc);
  cfd::core::ByteData::~ByteData(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_121 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_38);
  local_122 = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_120,"value.HasBlinding()","false",&local_121,&local_122);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  AVar3 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_38);
  local_170 = AVar3.amount_;
  local_168 = AVar3.ignore_check_;
  local_160.amount_ = local_170;
  local_160.ignore_check_ = (bool)local_168;
  local_150 = cfd::core::Amount::GetSatoshiValue(&local_160);
  local_174 = 100000000;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_148,"value.GetAmount().GetSatoshiValue()","100000000",
             &local_150,&local_174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)local_38);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata9) {
  // 8byte
  ConfidentialValue value(ByteData("010000000005f5e100"));
  EXPECT_STREQ(value.GetHex().c_str(), "010000000005f5e100");
  EXPECT_EQ(value.GetData().GetDataSize(), 9);
  EXPECT_EQ(value.HasBlinding(), false);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 100000000);
}